

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined4 in_EAX;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  batch<float,_xsimd::sse4_2> bVar15;
  batch bVar16;
  batch<float,_xsimd::sse4_2> local_18;
  
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = in_XMM0_Dc;
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = in_XMM0_Dd;
  fVar3 = ctx->sin_start_angle;
  iVar8 = -(uint)(fVar3 < sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                          super_simd_register<float,_xsimd::sse4_1>.
                          super_simd_register<float,_xsimd::ssse3>.
                          super_simd_register<float,_xsimd::sse3>.
                          super_simd_register<float,_xsimd::sse2>.data[0]);
  iVar10 = -(uint)(fVar3 < sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data[1]);
  auVar14._4_4_ = iVar10;
  auVar14._0_4_ = iVar8;
  auVar14._8_4_ = -(uint)(fVar3 < in_XMM0_Dc);
  auVar14._12_4_ = -(uint)(fVar3 < in_XMM0_Dd);
  iVar7 = movmskps(in_EAX,auVar14);
  if (iVar7 == 0) {
    uVar12 = 0x3f8000003f800000;
  }
  else {
    fVar4 = ctx->sin_end_angle;
    uVar9 = -(uint)(sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                    super_simd_register<float,_xsimd::sse4_1>.
                    super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>
                    .super_simd_register<float,_xsimd::sse2>.data[0] < fVar4);
    uVar11 = -(uint)(sin_angle.super_simd_register<float,_xsimd::sse4_2>.
                     super_simd_register<float,_xsimd::sse4_1>.
                     super_simd_register<float,_xsimd::ssse3>.
                     super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>
                     .data[1] < fVar4);
    auVar13._4_4_ = uVar11;
    auVar13._0_4_ = uVar9;
    auVar13._8_4_ = -(uint)(in_XMM0_Dc < fVar4);
    auVar13._12_4_ = -(uint)(in_XMM0_Dd < fVar4);
    iVar7 = movmskps(iVar7,auVar13);
    if (iVar7 == 0) {
      uVar12 = 0;
    }
    else {
      fVar5 = ctx->m;
      bVar15 = xsimd::asin<float,xsimd::sse4_2>(&local_18);
      fVar1 = ctx->c;
      auVar6._4_4_ = iVar10;
      auVar6._0_4_ = iVar8;
      auVar6._8_4_ = -(uint)(fVar3 < in_XMM0_Dc);
      auVar6._12_4_ = -(uint)(fVar3 < in_XMM0_Dd);
      auVar2._4_4_ = uVar11 & (uint)(fVar1 + bVar15.super_simd_register<float,_xsimd::sse4_2>.
                                             super_simd_register<float,_xsimd::sse4_1>.
                                             super_simd_register<float,_xsimd::ssse3>.
                                             super_simd_register<float,_xsimd::sse3>.
                                             super_simd_register<float,_xsimd::sse2>.data[1] * fVar5
                                    );
      auVar2._0_4_ = uVar9 & (uint)(fVar1 + bVar15.super_simd_register<float,_xsimd::sse4_2>.
                                            super_simd_register<float,_xsimd::sse4_1>.
                                            super_simd_register<float,_xsimd::ssse3>.
                                            super_simd_register<float,_xsimd::sse3>.
                                            super_simd_register<float,_xsimd::sse2>.data[0] * fVar5)
      ;
      auVar2._8_4_ = -(uint)(in_XMM0_Dc < fVar4) & (uint)(fVar1 + extraout_XMM0_Dc * fVar5);
      auVar2._12_4_ = -(uint)(in_XMM0_Dd < fVar4) & (uint)(fVar1 + extraout_XMM0_Dd * fVar5);
      auVar14 = blendvps(_DAT_0017a5c0,auVar2,auVar6);
      uVar12 = auVar14._0_8_;
    }
  }
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar12;
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)uVar12 >> 0x20);
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar12;
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)uVar12 >> 0x20);
  return (batch)bVar16.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }